

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O0

void __thiscall
JsonString_BadEscape2_Test::~JsonString_BadEscape2_Test(JsonString_BadEscape2_Test *this)

{
  JsonString_BadEscape2_Test *this_local;
  
  ~JsonString_BadEscape2_Test(this);
  operator_delete(this,0x338);
  return;
}

Assistant:

TEST_F (JsonString, BadEscape2) {
    auto p = json::make_parser (proxy_);
    p.input ("\"\\\xC3\xBF\"").eof ();
    EXPECT_EQ (p.last_error (), make_error_code (json::error_code::invalid_escape_char));
    EXPECT_EQ (p.coordinate (), (json::coord{4U, 1U}));
}